

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.H
# Opt level: O1

void __thiscall
amrex::MLNodeLinOp::compFlux
          (MLNodeLinOp *this,int param_1,Array<MultiFab_*,_3> *param_2,MultiFab *param_3,
          Location param_4)

{
  Abort_host("AMReX_MLNodeLinOp::compFlux::How did we get here?");
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_FORCE_INLINE
    void Abort (const char * msg = 0) {
#if AMREX_DEVICE_COMPILE
#if defined(NDEBUG)
        amrex::ignore_unused(msg);
#else
        if (msg) AMREX_DEVICE_PRINTF("Abort %s\n", msg);
        AMREX_DEVICE_ASSERT(0);
#endif
#else
        Abort_host(msg);
#endif
    }